

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometricModel.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
csm::GeometricModel::getParameterSetIndices
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,GeometricModel *this,Set pSet)

{
  iterator __position;
  int iVar1;
  int iVar2;
  ulong uVar3;
  uint local_2c;
  
  iVar1 = (*(this->super_Model)._vptr_Model[0x13])(this);
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,(long)iVar1);
  local_2c = 0;
  if (0 < iVar1) {
    uVar3 = 0;
    do {
      iVar2 = (*(this->super_Model)._vptr_Model[0x1b])(this,uVar3);
      if (iVar2 == 3) {
        if (pSet != ADJUSTABLE) {
LAB_001139f5:
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                       (int *)&local_2c);
          }
          else {
            *__position._M_current = local_2c;
            (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
      }
      else if ((pSet != NON_ADJUSTABLE) && (iVar2 != 0)) goto LAB_001139f5;
      local_2c = local_2c + 1;
      uVar3 = (ulong)local_2c;
    } while ((int)local_2c < iVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int> GeometricModel::getParameterSetIndices(param::Set pSet) const
{
   const int NUM_PARMS = getNumParameters();
   
   std::vector<int> indices;
   indices.reserve(NUM_PARMS);
   
   for (int i = 0; i < NUM_PARMS; ++i)
   {
      param::Type pType = getParameterType(i);
      if (pType == param::FIXED)
      {
         if (pSet != param::ADJUSTABLE) indices.push_back(i);
      }
      else if ((pType != param::NONE) && (pSet != param::NON_ADJUSTABLE))
      {
         indices.push_back(i);
      }
   }
   return indices;
}